

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O0

int ipc_remove_stale(char *path)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  size_t sz;
  char acStack_88 [6];
  sockaddr_un sa;
  int fd;
  char *path_local;
  
  if (path == (char *)0x0) {
    path_local._4_4_ = 0;
  }
  else {
    sz._6_2_ = 1;
    unique0x100000df = path;
    sVar2 = nni_strlcpy(acStack_88,path,0x6c);
    if (sVar2 < 0x6c) {
      sa.sun_path._100_4_ = socket(1,0x80001,0);
      if ((int)sa.sun_path._100_4_ < 0) {
        piVar3 = __errno_location();
        path_local._4_4_ = nni_plat_errno(*piVar3);
      }
      else {
        fcntl(sa.sun_path._100_4_,4,0x800);
        iVar1 = connect(sa.sun_path._100_4_,(sockaddr *)((long)&sz + 6),0x6e);
        if ((iVar1 < 0) && (piVar3 = __errno_location(), *piVar3 == 0x6f)) {
          unlink(stack0xffffffffffffffe8);
        }
        close(sa.sun_path._100_4_);
        path_local._4_4_ = 0;
      }
    }
    else {
      path_local._4_4_ = 0xf;
    }
  }
  return path_local._4_4_;
}

Assistant:

static int
ipc_remove_stale(const char *path)
{
	int                fd;
	struct sockaddr_un sa;
	size_t             sz;

	if (path == NULL) {
		return (0);
	}

	sa.sun_family = AF_UNIX;
	sz            = sizeof(sa.sun_path);

	if (nni_strlcpy(sa.sun_path, path, sz) >= sz) {
		return (NNG_EADDRINVAL);
	}

	if ((fd = socket(AF_UNIX, SOCK_STREAM | SOCK_CLOEXEC, 0)) < 0) {
		return (nni_plat_errno(errno));
	}

	// There is an assumption here that connect() returns immediately
	// (even when non-blocking) when a server is absent.  This seems
	// to be true for the platforms we've tried.  If it doesn't work,
	// then the cleanup will fail.  As this is supposed to be an
	// exceptional case, don't worry.
	(void) fcntl(fd, F_SETFL, O_NONBLOCK);
	if (connect(fd, (void *) &sa, sizeof(sa)) < 0) {
		if (errno == ECONNREFUSED) {
			(void) unlink(path);
		}
	}
	(void) close(fd);
	return (0);
}